

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.h
# Opt level: O2

RegSlot __thiscall
ByteCodeGenerator::EmitLdObjProto
          (ByteCodeGenerator *this,OpCode op,RegSlot objReg,FuncInfo *funcInfo)

{
  RegSlot R0;
  
  R0 = FuncInfo::AcquireTmpRegister(funcInfo);
  Js::ByteCodeWriter::Reg2(&this->m_writer,op,R0,objReg);
  FuncInfo::ReleaseTmpRegister(funcInfo,R0);
  return R0;
}

Assistant:

Js::RegSlot EmitLdObjProto(Js::OpCode op, Js::RegSlot objReg, FuncInfo *funcInfo)
    {
        // LdHomeObjProto protoReg, objReg
        // LdFuncObjProto protoReg, objReg
        Js::RegSlot protoReg = funcInfo->AcquireTmpRegister();
        this->Writer()->Reg2(op, protoReg, objReg);
        funcInfo->ReleaseTmpRegister(protoReg);
        return protoReg;
    }